

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_stream_parser.cc
# Opt level: O3

void __thiscall
google::protobuf::util::converter::JsonStreamParser::~JsonStreamParser(JsonStreamParser *this)

{
  pointer pcVar1;
  
  this->_vptr_JsonStreamParser = (_func_int **)&PTR__JsonStreamParser_003bce80;
  pcVar1 = (this->utf8_replacement_character_)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->utf8_replacement_character_).field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->chunk_storage_)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->chunk_storage_).field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->parsed_storage_)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->parsed_storage_).field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->key_storage_)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->key_storage_).field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->leftover_)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->leftover_).field_2) {
    operator_delete(pcVar1);
  }
  std::
  _Deque_base<google::protobuf::util::converter::JsonStreamParser::ParseType,_std::allocator<google::protobuf::util::converter::JsonStreamParser::ParseType>_>
  ::~_Deque_base((_Deque_base<google::protobuf::util::converter::JsonStreamParser::ParseType,_std::allocator<google::protobuf::util::converter::JsonStreamParser::ParseType>_>
                  *)&this->stack_);
  return;
}

Assistant:

JsonStreamParser::~JsonStreamParser() {}